

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

big_integer *
anon_unknown.dwarf_be5a::merge_all<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  pointer pbVar1;
  bool bVar2;
  big_integer *extraout_RAX;
  pointer a_00;
  char *in_R9;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  big_integer ab;
  big_integer b;
  big_integer a;
  AssertHelper local_1e0;
  Message local_1d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  size_t *local_1c8 [2];
  size_t local_1b8 [5];
  big_integer *local_190;
  AssertHelper local_188;
  undefined1 local_180 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178 [6];
  big_integer local_148;
  big_integer local_110;
  big_integer local_d8;
  big_integer local_a0;
  big_integer local_68;
  
  a_00 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pbVar1 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_190 = __return_storage_ptr__;
  if (a_00 != pbVar1) {
    if (1 < (ulong)(((long)pbVar1 - (long)a_00 >> 3) * 0x6db6db6db6db6db7)) {
      do {
        extract_random_element<big_integer>(&local_68,v);
        extract_random_element<big_integer>(&local_a0,v);
        big_integer::big_integer(&local_110,&local_68);
        operator*(&local_d8,&local_110,&local_a0);
        big_integer::~big_integer(&local_110);
        big_integer::big_integer(&local_148,&local_d8);
        operator/((big_integer *)local_1c8,&local_148,&local_68);
        local_180[0] = (internal)operator==((big_integer *)local_1c8,&local_a0);
        local_178[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
        ;
        big_integer::~big_integer((big_integer *)local_1c8);
        big_integer::~big_integer(&local_148);
        if (local_180[0] == (internal)0x0) {
          testing::Message::Message(&local_1d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_180,(AssertionResult *)"ab / a == b",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                     ,0x2a5,(char *)local_1c8[0]);
          testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
          testing::internal::AssertHelper::~AssertHelper(&local_1e0);
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
          if (CONCAT71(local_1d8.ss_.ptr_._1_7_,local_1d8.ss_.ptr_._0_1_) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT71(local_1d8.ss_.ptr_._1_7_,local_1d8.ss_.ptr_._0_1_) != (long *)0x0))
            {
              (**(code **)(*(long *)CONCAT71(local_1d8.ss_.ptr_._1_7_,local_1d8.ss_.ptr_._0_1_) + 8)
              )();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          big_integer::big_integer((big_integer *)local_180,&local_d8);
          operator/((big_integer *)local_1c8,(big_integer *)local_180,&local_a0);
          local_1d8.ss_.ptr_._0_1_ = (internal)operator==((big_integer *)local_1c8,&local_68);
          local_1d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          big_integer::~big_integer((big_integer *)local_1c8);
          big_integer::~big_integer((big_integer *)local_180);
          if (local_1d8.ss_.ptr_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_1e0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_1c8,(internal *)&local_1d8,(AssertionResult *)"ab / b == a",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_188,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                       ,0x2a6,(char *)local_1c8[0]);
            testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1e0);
            testing::internal::AssertHelper::~AssertHelper(&local_188);
            if (local_1c8[0] != local_1b8) {
              operator_delete(local_1c8[0],local_1b8[0] + 1);
            }
            if (local_1e0.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_1e0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_1e0.data_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_1d0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_1d0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            std::vector<big_integer,_std::allocator<big_integer>_>::push_back(v,&local_d8);
          }
        }
        big_integer::~big_integer(&local_d8);
        big_integer::~big_integer(&local_a0);
        big_integer::~big_integer(&local_68);
        a_00 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
               super__Vector_impl_data._M_start;
      } while (1 < (ulong)(((long)(v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)a_00 >> 3) *
                          0x6db6db6db6db6db7));
    }
    big_integer::big_integer(local_190,a_00);
    return extraout_RAX;
  }
  __assert_fail("!v.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                ,0x2ae,"T (anonymous namespace)::merge_all(std::vector<T>) [T = big_integer]");
}

Assistant:

T merge_all(std::vector<T> v)
    {
        assert(!v.empty());

        while (v.size() >= 2)
            merge_two(v);

        return v[0];
    }